

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O1

bool __thiscall GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::IsGB(MI<8UL,_GF2::MOGrevlex<8UL>_> *this)

{
  MP<8UL,_GF2::MOGrevlex<8UL>_> *pMVar1;
  _List_node_base *p_Var2;
  ulong i;
  _List_node_base *p_Var3;
  bool bVar4;
  bool bVar5;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  MP<8UL,_GF2::MOGrevlex<8UL>_> local_50;
  
  local_50.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node._M_size = 0;
  bVar4 = (this->
          super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ).
          super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)this;
  p_Var2 = (_List_node_base *)&local_50;
  local_50.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_50;
  if (!bVar4) {
    p_Var3 = (_List_node_base *)this;
    do {
      i = 0;
      do {
        if (((ulong)p_Var3->_M_prev[1]._M_next[1]._M_next >> (i & 0x3f) & 1) != 0) {
          pMVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
                             (&local_50,i,(MP<8UL,_GF2::MOGrevlex<8UL>_> *)(p_Var3->_M_prev + 1));
          Reduce(this,pMVar1);
          p_Var2 = local_50.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
                   super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                   super__List_node_base._M_next;
          if (local_50.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
              super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node._M_size
              != 0) goto joined_r0x0012d87f;
        }
        i = i + 1;
      } while (i != 8);
      for (p_Var2 = p_Var3->_M_prev;
          bVar5 = p_Var2 != (this->
                            super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                            ).
                            super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next, bVar5;
          p_Var2 = p_Var2->_M_prev) {
        if (((ulong)p_Var3->_M_prev[1]._M_next[1]._M_next &
            (ulong)p_Var2->_M_prev[1]._M_next[1]._M_next) != 0) {
          pMVar1 = MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
                             (&local_50,(MP<8UL,_GF2::MOGrevlex<8UL>_> *)(p_Var3->_M_prev + 1),
                              (MP<8UL,_GF2::MOGrevlex<8UL>_> *)(p_Var2->_M_prev + 1));
          Reduce(this,pMVar1);
          if (local_50.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
              super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node._M_size
              != 0) goto LAB_0012d85a;
        }
      }
      Env::Trace("IsGB: %zu polys");
LAB_0012d85a:
      p_Var2 = local_50.super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>.
               super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
               super__List_node_base._M_next;
      if (bVar5) break;
      p_Var3 = p_Var3->_M_prev;
      bVar4 = p_Var3 == (this->
                        super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        ).
                        super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
    } while (!bVar4);
  }
joined_r0x0012d87f:
  while (p_Var2 != (_List_node_base *)&local_50) {
    p_Var3 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var2->_M_next)->
             super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  return bVar4;
}

Assistant:

bool IsGB() const
	{
		MP<_n, _O> poly(_order);
		// цикл по многочленам
		size_t trace = 0;
        for (const_reverse_iterator iter = rbegin(); iter != rend(); ++iter)
		{
			// цикл по парам (многочлен, уравнение поля)
			for (size_t i = 0; i < _n; i++)
				if (iter->LM().Test(i))
				{
					Reduce(poly.SPoly(i, *iter));
					if (poly != 0)
						return false;
				}
			// цикл по парам (многочлен, многочлен1)
			const_reverse_iterator iter1 = iter;
			for (++iter1; iter1 != rend(); ++iter1)
				if (!iter->LM().IsRelPrime(iter1->LM()))
				{
					Reduce(poly.SPoly(*iter, *iter1));
					if (poly != 0) 
						return false;
				}
			// трассировка
			Env::Trace("IsGB: %zu polys", ++trace);
		}
		return true;
	}